

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall
MODEL3D::three_dim_model::path_to_co_ord(three_dim_model *this,Path *in_path,co_ord *out_co_ord)

{
  pointer pIVar1;
  pointer pIVar2;
  co_ord holder_co_ord;
  int local_6c;
  co_ord local_68;
  
  local_68.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pIVar1 = (in_path->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar2 = (in_path->
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                _M_impl.super__Vector_impl_data._M_start; pIVar2 != pIVar1; pIVar2 = pIVar2 + 1) {
    local_6c = (int)pIVar2->X;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&local_68.x,&local_6c);
    local_6c = (int)pIVar2->Y;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&local_68.y,&local_6c);
  }
  co_ord::operator=(out_co_ord,&local_68);
  co_ord::~co_ord(&local_68);
  return;
}

Assistant:

void MODEL3D::three_dim_model::path_to_co_ord(const ClipperLib::Path &in_path, co_ord &out_co_ord)
{
    co_ord holder_co_ord;
    //For each clipper point, push onto co_ord
    auto path_it_end = in_path.end();
    for (auto i = in_path.begin(); i != path_it_end; i++)
    {
        holder_co_ord.x.push_back(i->X);
        holder_co_ord.y.push_back(i->Y);
    }
    out_co_ord = holder_co_ord;
}